

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int LEnum(TValue *l,TValue *r)

{
  lua_Number lf;
  lua_Integer li;
  TValue *r_local;
  TValue *l_local;
  
  if (((l->tt_ & 0xf) == 3) && ((r->tt_ & 0xf) == 3)) {
    if (l->tt_ == 0x13) {
      if (l->tt_ != 0x13) {
        __assert_fail("((((l))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x29e,"int LEnum(const TValue *, const TValue *)");
      }
      if (r->tt_ == 0x13) {
        if (r->tt_ != 0x13) {
          __assert_fail("((((r))->tt_) == (((3) | ((1) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x2a0,"int LEnum(const TValue *, const TValue *)");
        }
        l_local._4_4_ = (uint)((l->value_).i <= (r->value_).i);
      }
      else {
        if (r->tt_ != 3) {
          __assert_fail("((((r))->tt_) == (((3) | ((0) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x2a2,"int LEnum(const TValue *, const TValue *)");
        }
        l_local._4_4_ = LEintfloat((l->value_).i,(r->value_).n);
      }
    }
    else {
      if (l->tt_ != 3) {
        __assert_fail("((((l))->tt_) == (((3) | ((0) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x2a5,"int LEnum(const TValue *, const TValue *)");
      }
      if (r->tt_ == 3) {
        if (r->tt_ != 3) {
          __assert_fail("((((r))->tt_) == (((3) | ((0) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x2a7,"int LEnum(const TValue *, const TValue *)");
        }
        l_local._4_4_ = (uint)((l->value_).n <= (r->value_).n);
      }
      else {
        if (r->tt_ != 0x13) {
          __assert_fail("((((r))->tt_) == (((3) | ((1) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x2a9,"int LEnum(const TValue *, const TValue *)");
        }
        l_local._4_4_ = LEfloatint((l->value_).n,(r->value_).i);
      }
    }
    return l_local._4_4_;
  }
  __assert_fail("(((((((l))->tt_)) & 0x0F)) == (3)) && (((((((r))->tt_)) & 0x0F)) == (3))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                ,0x29c,"int LEnum(const TValue *, const TValue *)");
}

Assistant:

static int LEnum (const TValue *l, const TValue *r) {
  lua_assert(ttisnumber(l) && ttisnumber(r));
  if (ttisinteger(l)) {
    lua_Integer li = ivalue(l);
    if (ttisinteger(r))
      return li <= ivalue(r);  /* both are integers */
    else  /* 'l' is int and 'r' is float */
      return LEintfloat(li, fltvalue(r));  /* l <= r ? */
  }
  else {
    lua_Number lf = fltvalue(l);  /* 'l' must be float */
    if (ttisfloat(r))
      return luai_numle(lf, fltvalue(r));  /* both are float */
    else  /* 'l' is float and 'r' is int */
      return LEfloatint(lf, ivalue(r));
  }
}